

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O0

void pty_free(Backend *be)

{
  Pty *pty_00;
  int local_1c;
  int i;
  Pty *pty;
  Backend *be_local;
  
  pty_00 = (Pty *)(be + -0x10c);
  pty_close(pty_00);
  del234(ptys_by_pid,pty_00);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    if (-1 < *(int *)&be[(long)local_1c + -0x10a].interactor) {
      del234(ptyfds,&be[(long)local_1c + -0x10a].interactor);
    }
  }
  bufchain_clear((bufchain *)(be + -3));
  conf_free(pty_00->conf);
  pty_00->conf = (Conf *)0x0;
  if (pty_00 != single_pty) {
    safefree(pty_00);
  }
  return;
}

Assistant:

static void pty_free(Backend *be)
{
    Pty *pty = container_of(be, Pty, backend);
    int i;

    pty_close(pty);

    /* Either of these may fail `not found'. That's fine with us. */
    del234(ptys_by_pid, pty);
    for (i = 0; i < 3; i++)
        if (pty->fds[i].fd >= 0)
            del234(ptyfds, &pty->fds[i]);

    bufchain_clear(&pty->output_data);

    conf_free(pty->conf);
    pty->conf = NULL;

    if (pty == single_pty) {
        /*
         * Leave this structure around in case we need to Restart
         * Session.
         */
    } else {
        sfree(pty);
    }
}